

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileApprover.cpp
# Opt level: O0

int ApprovalTests::FileApprover::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  long *plVar1;
  EVP_PKEY_CTX *pEVar2;
  int iVar3;
  size_t siglen_00;
  double __x;
  ApprovalException *anon_var_0;
  string receivedPath;
  string approvedPath;
  string *in_stack_ffffffffffffff10;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [48];
  string local_58 [32];
  string local_38 [32];
  size_t local_18;
  long *local_10;
  EVP_PKEY_CTX *local_8;
  
  local_18 = siglen;
  local_10 = (long *)sig;
  local_8 = ctx;
  (**(code **)(*(long *)sig + 0x10))();
  (**(code **)(*(long *)ctx + 0x10))(local_38,ctx,local_58);
  ::std::__cxx11::string::~string(local_58);
  pEVar2 = local_8;
  (**(code **)(*local_10 + 0x10))(local_a8);
  (**(code **)(*(long *)pEVar2 + 0x18))(local_88,pEVar2,local_a8);
  __x = (double)::std::__cxx11::string::~string(local_a8);
  ApprovalFileLog::log(__x);
  SystemUtils::ensureParentDirectoryExists(in_stack_ffffffffffffff10);
  SystemUtils::ensureParentDirectoryExists(in_stack_ffffffffffffff10);
  plVar1 = local_10;
  ::std::__cxx11::string::string(local_c8,local_88);
  (**(code **)(*plVar1 + 0x18))(plVar1,local_c8);
  ::std::__cxx11::string::~string(local_c8);
  verify((EVP_PKEY_CTX *)local_88,(uchar *)local_38,siglen_00,tbs,tbslen);
  plVar1 = local_10;
  ::std::__cxx11::string::string(local_e8,local_88);
  (**(code **)(*plVar1 + 0x20))(plVar1,local_e8);
  ::std::__cxx11::string::~string(local_e8);
  notifyTestPassed();
  ::std::__cxx11::string::~string(local_88);
  iVar3 = ::std::__cxx11::string::~string(local_38);
  return iVar3;
}

Assistant:

void FileApprover::verify(const ApprovalNamer& n,
                              const ApprovalWriter& s,
                              const Reporter& r)
    {
        std::string const approvedPath = n.getApprovedFile(s.getFileExtensionWithDot());
        std::string const receivedPath = n.getReceivedFile(s.getFileExtensionWithDot());

        ApprovalFileLog::log(approvedPath);
        SystemUtils::ensureParentDirectoryExists(approvedPath);
        SystemUtils::ensureParentDirectoryExists(receivedPath);
        s.write(receivedPath);
        try
        {
            verify(receivedPath, approvedPath);
            s.cleanUpReceived(receivedPath);
            notifyTestPassed();
        }
        catch (const ApprovalException&)
        {
            // FailedFileLog::log(receivedPath, approvedPath);
            reportAfterTryingFrontLoadedReporter(receivedPath, approvedPath, r);
            throw;
        }
    }